

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ising_polynomial_sa_system.hpp
# Opt level: O2

void __thiscall
openjij::system::
SASystem<openjij::graph::IsingPolynomialModel<double>,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
::Flip(SASystem<openjij::graph::IsingPolynomialModel<double>,_std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
       *this,int32_t index)

{
  char *pcVar1;
  double dVar2;
  short sVar3;
  int iVar4;
  vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
  *pvVar5;
  pointer pvVar6;
  pointer puVar7;
  pointer psVar8;
  unsigned_long uVar9;
  pointer ppVar10;
  int *piVar11;
  pointer pcVar12;
  pointer pdVar13;
  unsigned_long *index_key;
  pointer puVar14;
  int *v_index;
  int *piVar15;
  
  pcVar1 = (this->sample_).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data._M_start + index;
  *pcVar1 = -*pcVar1;
  pvVar5 = this->key_value_list_;
  pvVar6 = (this->adjacency_list_->
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  puVar7 = *(pointer *)
            ((long)&pvVar6[index].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data + 8);
  psVar8 = (this->term_prod_).super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (puVar14 = pvVar6[index].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start; puVar14 != puVar7; puVar14 = puVar14 + 1)
  {
    uVar9 = *puVar14;
    ppVar10 = (pvVar5->
              super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    dVar2 = ppVar10[uVar9].second;
    sVar3 = psVar8[uVar9];
    psVar8[uVar9] = -sVar3;
    piVar11 = *(pointer *)
               ((long)&ppVar10[uVar9].first.super__Vector_base<int,_std::allocator<int>_>._M_impl +
               8);
    pcVar12 = (this->sample_).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    pdVar13 = (this->base_energy_difference_).super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start;
    for (piVar15 = *(int **)&ppVar10[uVar9].first.super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl; piVar15 != piVar11; piVar15 = piVar15 + 1) {
      iVar4 = *piVar15;
      if (iVar4 != index) {
        pdVar13[iVar4] =
             (double)(int)pcVar12[iVar4] * (double)(int)sVar3 * dVar2 * -2.0 + pdVar13[iVar4];
      }
    }
  }
  return;
}

Assistant:

void Flip(const std::int32_t index) {
      sample_[index] *= -1;
      for (const auto &index_key: adjacency_list_[index]) {
         const ValueType val = -2*key_value_list_[index_key].second*term_prod_[index_key];
         term_prod_[index_key] *= -1;
         for (const auto &v_index: key_value_list_[index_key].first) {
            if (v_index != index) {
               base_energy_difference_[v_index] += val*sample_[v_index];
            }
         }
      }
   }